

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

void __thiscall QIconModeViewBase::updateContentsSize(QIconModeViewBase *this)

{
  long lVar1;
  QRect *r;
  qsizetype qVar2;
  QSize QVar3;
  QListViewItem *in_RDI;
  long in_FS_OFFSET;
  int i;
  QRect bounding;
  qsizetype in_stack_ffffffffffffffa8;
  QRect *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QRect::QRect(in_stack_ffffffffffffffb0);
  iVar4 = 0;
  while( true ) {
    r = (QRect *)(long)iVar4;
    qVar2 = QList<QListViewItem>::size((QList<QListViewItem> *)&in_RDI[4].visited);
    if (qVar2 <= (long)r) break;
    QList<QListViewItem>::at((QList<QListViewItem> *)r,in_stack_ffffffffffffffa8);
    QListViewItem::rect(in_RDI);
    QRect::operator|=((QRect *)in_RDI,r);
    iVar4 = iVar4 + 1;
  }
  QVar3 = QRect::size((QRect *)CONCAT44(iVar4,in_stack_ffffffffffffffc0));
  *(QSize *)&in_RDI[1].y = QVar3;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QIconModeViewBase::updateContentsSize()
{
    QRect bounding;
    for (int i = 0; i < items.size(); ++i)
        bounding |= items.at(i).rect();
    contentsSize = bounding.size();
}